

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QRect __thiscall QDockAreaLayout::gapRect(QDockAreaLayout *this,DockPosition dockPos)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  QWidgetData *pQVar6;
  undefined1 auVar7 [16];
  QMainWindow *pQVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  int iVar15;
  double dVar16;
  double dVar17;
  QRect QVar18;
  char local_50 [4];
  undefined1 local_4c [16];
  undefined4 local_3c;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = this->mainWindow;
  pQVar6 = (pQVar8->super_QWidget).data;
  uVar1 = (pQVar6->crect).x2;
  uVar3 = (pQVar6->crect).y2;
  uVar2 = (pQVar6->crect).x1;
  uVar4 = (pQVar6->crect).y1;
  iVar15 = (uVar3 - uVar4) + 1;
  dVar16 = (double)((uVar1 - uVar2) + 1) * 0.5;
  dVar16 = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
  dVar17 = (double)((ulong)((double)iVar15 * 0.5) & 0x8000000000000000 | 0x3fe0000000000000) +
           (double)iVar15 * 0.5;
  auVar7._4_4_ = -(uint)(-2147483648.0 < dVar16);
  auVar7._0_4_ = -(uint)(-2147483648.0 < dVar17);
  auVar7._8_4_ = -(uint)(2147483647.0 < dVar17);
  auVar7._12_4_ = -(uint)(2147483647.0 < dVar16);
  uVar9 = movmskps((int)pQVar6,auVar7);
  iVar14 = (int)dVar16;
  if (0x4f < (int)dVar16) {
    iVar14 = 0x50;
  }
  if ((uVar9 & 2) == 0) {
    iVar14 = -0x80000000;
  }
  iVar13 = (int)dVar17;
  if (0x4f < (int)dVar17) {
    iVar13 = 0x50;
  }
  if ((uVar9 & 1) == 0) {
    iVar13 = -0x80000000;
  }
  if ((uVar9 & 8) != 0) {
    iVar14 = 0x50;
  }
  if ((uVar9 & 4) != 0) {
    iVar13 = 0x50;
  }
  if (SBORROW4(iVar15,this->sep * 2) != iVar15 + this->sep * -2 < 0) {
    QtPrivateLogging::lcQpaDockWidgets();
    pQVar8 = this->mainWindow;
    if (((byte)QtPrivateLogging::lcQpaDockWidgets::category.field_2.bools.enabledWarning._q_value.
               _M_base._M_i & 1) != 0) {
      local_50[0] = '\x02';
      local_50[1] = '\0';
      local_50[2] = '\0';
      local_50[3] = '\0';
      local_4c = (undefined1  [16])0x0;
      local_3c = 0;
      local_38 = QtPrivateLogging::lcQpaDockWidgets::category.name;
      pQVar6 = (pQVar8->super_QWidget).data;
      QMessageLogger::warning
                (local_50,
                 "QDockAreaLayout::gapRect: Main window height %i is too small. Docking will not be possible."
                 ,(ulong)(((pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i) + 1));
      pQVar8 = this->mainWindow;
    }
  }
  pQVar6 = (pQVar8->super_QWidget).data;
  if ((((pQVar6->crect).x2.m_i - (pQVar6->crect).x1.m_i) + 1 < this->sep * 2) &&
     (QtPrivateLogging::lcQpaDockWidgets(),
     ((byte)QtPrivateLogging::lcQpaDockWidgets::category.field_2.bools.enabledWarning._q_value.
            _M_base._M_i & 1) != 0)) {
    gapRect();
  }
  switch(dockPos) {
  case LeftDock:
    uVar9 = (this->rect).x1.m_i;
    uVar11 = (ulong)(uint)(this->rect).y1.m_i;
    uVar12 = (ulong)(uint)(this->rect).y2.m_i;
    uVar10 = (ulong)((iVar14 + uVar9) - 1);
    break;
  case RightDock:
    uVar11 = (ulong)(uint)(this->rect).y1.m_i;
    iVar15 = (this->rect).x2.m_i;
    uVar9 = iVar15 - iVar14;
    uVar12 = (ulong)(uint)(this->rect).y2.m_i;
    uVar10 = (ulong)(iVar15 - 1);
    break;
  case TopDock:
    uVar9 = (this->rect).x1.m_i;
    uVar5 = (this->rect).y1.m_i;
    uVar11 = (ulong)uVar5;
    uVar10 = (ulong)(uint)(this->rect).x2.m_i;
    uVar12 = (ulong)((iVar13 + uVar5) - 1);
    break;
  case BottomDock:
    uVar9 = (this->rect).x1.m_i;
    uVar10 = (ulong)(uint)(this->rect).x2.m_i;
    iVar14 = (this->rect).y2.m_i;
    uVar11 = (ulong)(uint)(iVar14 - iVar13);
    uVar12 = (ulong)(iVar14 - 1);
    break;
  default:
    uVar10 = 0xffffffff;
    uVar9 = 0;
    uVar11 = 0;
    uVar12 = 0xffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  QVar18._0_8_ = (ulong)uVar9 | uVar11 << 0x20;
  QVar18._8_8_ = uVar10 | uVar12 << 0x20;
  return QVar18;
}

Assistant:

QRect QDockAreaLayout::gapRect(QInternal::DockPosition dockPos) const
{
    Q_ASSERT_X(mainWindow, "QDockAreaLayout::gapRect", "Called without valid mainWindow pointer.");

    // Determine gap size depending on MainWindow size (QTBUG-101657)
    const QSize gapSize = (mainWindow->size()/2).boundedTo(QSize(EmptyDropAreaSize, EmptyDropAreaSize));

    // Warn if main window is too small to create proper docks.
    // Do not fail because this can be triggered by a user making MainWindow too small
    if (mainWindow->height() < (2 * sep)) {
        qCWarning(lcQpaDockWidgets,
            "QDockAreaLayout::gapRect: Main window height %i is too small. Docking will not be possible.",
            mainWindow->height());

    }
    if (mainWindow->width() < (2 * sep)) {
        qCWarning(lcQpaDockWidgets,
            "QDockAreaLayout::gapRect: Main window width %i is too small. Docking will not be possible.",
            mainWindow->width());
    }

    // Calculate rectangle of requested dock
    switch (dockPos) {
    case QInternal::LeftDock:
        return QRect(rect.left(), rect.top(), gapSize.width(), rect.height());
    case QInternal::RightDock:
        return QRect(rect.right() - gapSize.width(), rect.top(), gapSize.width(), rect.height());
    case QInternal::TopDock:
        return QRect(rect.left(), rect.top(), rect.width(), gapSize.height());
    case QInternal::BottomDock:
        return QRect(rect.left(), rect.bottom() - gapSize.height(), rect.width(), gapSize.height());
    case QInternal::DockCount:
        break;
    }
    return QRect();
}